

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::checkteamkills(void)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  
  uVar5 = gamemode + 3;
  if (((uVar5 < 0x1a) && ((0x3ffffe8UL >> ((ulong)uVar5 & 0x3f) & 1) != 0)) &&
     (lVar4 = (long)_DAT_00194e24, 0 < lVar4)) {
    puVar7 = (uint *)0x0;
    puVar6 = teamkillkicks;
    do {
      uVar1 = *puVar6;
      if (((uVar1 & 1 << ((byte)uVar5 & 0x1f)) != 0) &&
         ((puVar7 == (uint *)0x0 || ((uVar1 & ~*puVar7) == 0 && uVar1 != *puVar7)))) {
        puVar7 = puVar6;
      }
      puVar6 = puVar6 + 3;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  if ((puVar7 != (uint *)0x0) && (0 < (long)(int)DAT_00194e34)) {
    lVar4 = (long)(int)DAT_00194e34 + 1;
    do {
      lVar3 = teamkills;
      if ((int)puVar7[1] <= *(int *)(teamkills + -0xc + lVar4 * 8)) {
        if (0 < (int)puVar7[2]) {
          addban(*(uint *)(teamkills + -0x10 + lVar4 * 8),puVar7[2]);
        }
        kickclients(*(uint *)(lVar3 + -0x10 + lVar4 * 8),(clientinfo *)0x0);
        uVar5 = DAT_00194e34 - 1;
        bVar2 = 1 < (int)DAT_00194e34;
        DAT_00194e34 = uVar5;
        if (bVar2) {
          *(undefined8 *)(teamkills + -0x10 + lVar4 * 8) =
               *(undefined8 *)(teamkills + (ulong)uVar5 * 8);
        }
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  shouldcheckteamkills = 0;
  return;
}

Assistant:

void checkteamkills()
    {
        teamkillkick *kick = NULL;
        if(m_timed) loopv(teamkillkicks) if(teamkillkicks[i].match(gamemode) && (!kick || kick->includes(teamkillkicks[i])))
            kick = &teamkillkicks[i];
        if(kick) loopvrev(teamkills)
        {
            teamkillinfo &tk = teamkills[i];
            if(tk.teamkills >= kick->limit)
            {
                if(kick->ban > 0) addban(tk.ip, kick->ban);
                kickclients(tk.ip);
                teamkills.removeunordered(i);
            }
        }
        shouldcheckteamkills = false;
    }